

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_gemma::llm_build_gemma
          (llm_build_gemma *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  undefined8 uVar1;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ggml_backend_buffer *name;
  void *pvVar11;
  int extraout_var;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *pgVar14;
  const_reference pvVar15;
  ggml_tensor *pgVar16;
  pointer plVar17;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  float fVar18;
  ggml_tensor *unaff_retaddr;
  ggml_tensor *in_stack_00000008;
  int in_stack_00000010;
  ggml_tensor *sa_out;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffde8;
  int iVar19;
  llm_graph_context *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffdf8;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffe00;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffe08;
  undefined4 uVar20;
  llm_graph_context *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe48;
  llm_graph_context *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe88;
  ggml_tensor *in_stack_fffffffffffffe90;
  ggml_tensor *in_stack_fffffffffffffea8;
  ggml_tensor *in_stack_fffffffffffffeb0;
  ggml_tensor *in_stack_fffffffffffffeb8;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  int il_00;
  ggml_tensor *in_stack_fffffffffffffef8;
  llm_graph_context *in_stack_ffffffffffffff00;
  int local_5c;
  ggml_tensor *in_stack_ffffffffffffffb8;
  ggml_tensor *in_stack_ffffffffffffffc0;
  
  pgVar16 = in_RDI;
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffe00,
             (llm_graph_params *)in_stack_fffffffffffffdf8);
  inp = (llm_graph_input_attn_kv_unified *)(ulong)*(uint *)(in_RDI->buffer + 0x24);
  pgVar2 = llm_graph_context::build_inp_embd(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  pgVar3 = in_RDI->src[5];
  sqrtf((float)in_RDI->ne[2]);
  pgVar3 = (ggml_tensor *)ggml_scale(pgVar3,pgVar2);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (char *)in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pgVar2 = llm_graph_context::build_inp_pos(in_stack_fffffffffffffe50);
  pgVar4 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffe90);
  for (local_5c = 0; iVar19 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
      (long)local_5c < in_RDI->ne[3]; local_5c = local_5c + 1) {
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)local_5c);
    pgVar5 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                        (int)in_stack_fffffffffffffdf0);
    uVar20 = (undefined4)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (char *)in_stack_fffffffffffffdf0,iVar19);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)local_5c);
    pgVar6 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                        in_stack_fffffffffffffe40);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (char *)in_stack_fffffffffffffdf0,iVar19);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)local_5c);
    pgVar7 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                        in_stack_fffffffffffffe40);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (char *)in_stack_fffffffffffffdf0,iVar19);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)local_5c);
    pgVar8 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                        in_stack_fffffffffffffe40);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (char *)in_stack_fffffffffffffdf0,iVar19);
    uVar9 = ggml_reshape_3d(in_RDI->src[5],pgVar6,inp,in_RDI->nb[3],(long)*(int *)(in_RDI->src + 2))
    ;
    uVar10._0_4_ = in_RDI->op;
    uVar10._4_4_ = in_RDI->op_params[0];
    uVar10 = ggml_reshape_3d(in_RDI->src[5],pgVar7,inp,uVar10,(long)*(int *)(in_RDI->src + 2));
    uVar1._0_4_ = in_RDI->op;
    uVar1._4_4_ = in_RDI->op_params[0];
    name = (ggml_backend_buffer *)
           ggml_reshape_3d(in_RDI->src[5],pgVar8,inp,uVar1,(long)*(int *)(in_RDI->src + 2));
    pvVar11 = (void *)ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],
                                    in_RDI->op_params[0xf],in_RDI->flags,*(undefined4 *)in_RDI->src,
                                    *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar9,
                                    pgVar2,0,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],in_RDI->flags
                  ,*(undefined4 *)in_RDI->src,*(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],
                  uVar10,pgVar2,0,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (char *)in_stack_fffffffffffffdf0,iVar19);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (char *)in_stack_fffffffffffffdf0,iVar19);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (char *)in_stack_fffffffffffffdf0,iVar19);
    pgVar6 = in_RDI->src[5];
    fVar18 = sqrtf((float)(long)inp);
    ggml_scale(1.0 / fVar18,pgVar6,pvVar11);
    il_00 = (int)pvVar11;
    type_gate = (llm_ffn_gate_type)pgVar6;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (char *)in_stack_fffffffffffffdf0,iVar19);
    pgVar6 = pgVar4;
    pgVar7 = in_RCX;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)local_5c);
    pgVar14 = (ggml_tensor *)CONCAT44(uVar20,local_5c);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    iVar19 = extraout_var;
    pgVar8 = llm_graph_context::build_attn
                       ((llm_graph_context *)pgVar7,inp,(ggml_cgraph *)pgVar5,pgVar3,
                        in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RSI,pgVar16,
                        unaff_retaddr,in_stack_00000008,(float)((ulong)pgVar2 >> 0x20),
                        in_stack_00000010);
    pgVar5 = pgVar8;
    if ((long)local_5c == in_RDI->ne[3] + -1) {
      pgVar12 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffe40)
      ;
      in_stack_fffffffffffffeb8 = pgVar12;
      in_stack_fffffffffffffeb0 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],pgVar5,pgVar12);
      pgVar5 = in_stack_fffffffffffffeb0;
      in_stack_fffffffffffffea8 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],pgVar3,pgVar12);
      pgVar3 = in_stack_fffffffffffffea8;
    }
    type_op = (llm_ffn_op_type)pgVar8;
    pgVar13 = (ggml_tensor *)ggml_add(in_RDI->src[5],pgVar5,pgVar3);
    pgVar12 = pgVar13;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar19);
    pgVar8 = pgVar13;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)local_5c);
    pgVar14 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffe10,pgVar14,mw,cur_00,
                         (llm_norm_type)((ulong)name >> 0x20),(int)name);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar19);
    pvVar15 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                         &in_RSI[0x13].view_offs,(long)local_5c);
    pgVar3 = pvVar15->ffn_up;
    pvVar15 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                         &in_RSI[0x13].view_offs,(long)local_5c);
    pgVar5 = pvVar15->ffn_gate;
    pvVar15 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                         &in_RSI[0x13].view_offs,(long)local_5c);
    in_stack_fffffffffffffdf8 = pvVar15->ffn_down;
    in_stack_fffffffffffffe10 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffe08 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe00 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdf0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffde8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe88 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)pgVar8,in_stack_fffffffffffffe88,
                    (ggml_tensor *)&stack0xfffffffffffffde8,pgVar5,pgVar3,pgVar14,pgVar12,
                    in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                    pgVar6,in_RCX,type_op,type_gate,il_00);
    pgVar3 = in_stack_fffffffffffffe88;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (char *)in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    ggml_add(in_RDI->src[5],pgVar3,pgVar13);
    pgVar3 = llm_graph_context::build_cvec(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (char *)in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    in_RCX = pgVar7;
  }
  pgVar16 = llm_graph_context::build_norm
                      (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00
                       ,in_stack_fffffffffffffdf8,
                       (llm_norm_type)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                       (int)in_stack_fffffffffffffdf0);
  pgVar3 = pgVar16;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (char *)in_stack_fffffffffffffdf0,iVar19);
  plVar17 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4db83e);
  plVar17->t_embd = pgVar3;
  pgVar16 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)pgVar16,in_stack_fffffffffffffe48,pgVar3);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (char *)in_stack_fffffffffffffdf0,iVar19);
  pgVar3 = pgVar16;
  plVar17 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4db8c3);
  plVar17->t_logits = pgVar16;
  ggml_build_forward_expand(in_RCX,pgVar3);
  return;
}

Assistant:

llm_build_gemma(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        inpL = ggml_scale(ctx0, inpL, sqrtf(n_embd));
        cb(inpL, "inp_scaled", -1);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow);

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow);

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_scale(ctx0, Qcur, 1.0f / sqrtf(float(n_embd_head)));
                cb(Qcur, "Qcur_scaled", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f, il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            ggml_tensor * sa_out = ggml_add(ctx0, cur, inpL);
            cb(sa_out, "sa_out", il);

            cur = build_norm(sa_out,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            // feed-forward network
            {
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, sa_out);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }